

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

uint32_t __thiscall
front::syntax::SyntaxAnalyze::gm_const_init_val
          (SyntaxAnalyze *this,
          vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          *init_values,
          vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          *dimensions,uint32_t braceLayerNum)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  uint32_t uVar4;
  reference pvVar5;
  ExpressNode *this_00;
  uint uVar6;
  ulong __n;
  uint local_74;
  uint local_70;
  SharedExNdPtr value;
  
  local_70 = 1;
  for (__n = (ulong)(int)braceLayerNum;
      __n < (ulong)((long)(dimensions->
                          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(dimensions->
                          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1) {
    pvVar5 = std::
             vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ::at(dimensions,__n);
    local_70 = local_70 *
               ((pvVar5->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->_value;
  }
  local_74 = 0;
  while( true ) {
    bVar3 = try_word(this,1,RBRACE,COMMA,SEMICN);
    if (bVar3) break;
    bVar3 = try_word(this,1,LBRACE);
    if (bVar3) {
      match_one_word(this,LBRACE);
      uVar4 = gm_const_init_val(this,init_values,dimensions,braceLayerNum + 1);
      local_74 = local_74 + uVar4;
      match_one_word(this,RBRACE);
    }
    else {
      value.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      value.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      gm_exp((SyntaxAnalyze *)&stack0xffffffffffffffc0);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&value.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffffc0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back(init_values,
                  (value_type *)
                  &value.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                 );
      local_74 = local_74 + 1;
      psVar1 = (dimensions->
               super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      psVar2 = (dimensions->
               super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&value.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (psVar1 == psVar2) break;
    }
    bVar3 = try_word(this,1,COMMA);
    if (bVar3) {
      match_one_word(this,COMMA);
    }
  }
  for (uVar6 = local_74; uVar6 < local_70; uVar6 = uVar6 + 1) {
    value.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    value.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (ExpressNode *)operator_new(0x48);
    express::ExpressNode::ExpressNode(this_00);
    std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<front::express::ExpressNode,void>
              ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffc0,this_00);
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&value.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    (value.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _type = CNS;
    (value.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _operation = NUMBER;
    (value.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _value = 0;
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::push_back(init_values,
                (value_type *)
                &value.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&value.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  if (local_74 < local_70) {
    local_74 = local_70;
  }
  return local_74;
}

Assistant:

uint32_t SyntaxAnalyze::gm_const_init_val(vector<SharedExNdPtr> &init_values,
                                          vector<SharedExNdPtr> &dimensions,
                                          uint32_t braceLayerNum) {
  uint32_t totalValueNum;
  uint32_t nowValueNum;

  totalValueNum = 1;
  for (int i = braceLayerNum; i < dimensions.size(); i++) {
    totalValueNum *= dimensions.at(i)->_value;
  }
  nowValueNum = 0;

  while (!try_word(1, Token::RBRACE, Token::COMMA, Token::SEMICN)) {
    if (try_word(1, Token::LBRACE)) {
      match_one_word(Token::LBRACE);

      nowValueNum +=
          gm_const_init_val(init_values, dimensions, braceLayerNum + 1);

      match_one_word(Token::RBRACE);
    } else {
      nowValueNum++;
      SharedExNdPtr value;
      value = gm_const_exp();
      init_values.push_back(value);
      if (dimensions.size() == 0) {
        break;
      }
    }
    if (try_word(1, Token::COMMA)) {
      match_one_word(Token::COMMA);
    }
  }

  for (; nowValueNum < totalValueNum; nowValueNum++) {
    SharedExNdPtr value;
    value = SharedExNdPtr(new ExpressNode());
    value->_type = NodeType::CNS;
    value->_operation = OperationType::NUMBER;
    value->_value = 0;
    init_values.push_back(value);
  }

  return nowValueNum;
}